

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::doAtomicLoad
          (Literal *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Address addr,
          Index bytes,Type type,Name memoryName,Address memorySize)

{
  Type TVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_b0;
  undefined8 local_a0;
  undefined8 local_98;
  ulong local_90;
  undefined1 local_88;
  undefined1 *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [8];
  Const ptr;
  
  ptr.value.type.id = (uintptr_t)__return_storage_ptr__;
  checkAtomicAddress(this,addr,bytes,memorySize);
  local_68[0] = 0xe;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  ptr.value.field_0.i64 = 0;
  ptr.value.field_0.func.super_IString.str._M_str = (char *)0x0;
  local_b0.i32 = (int32_t)addr.addr;
  local_a0 = 2;
  wasm::Literal::operator=
            ((Literal *)
             &ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
             (Literal *)&local_b0.func);
  wasm::Literal::~Literal((Literal *)&local_b0.func);
  TVar1 = ptr.value.type;
  local_80 = local_68;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = IfId;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  local_b0.v128[0] = 0xc;
  local_98 = 0;
  local_a0._0_2_ = (ushort)(byte)bytes;
  local_90 = (ulong)bytes;
  local_88 = 1;
  local_78 = (undefined4)memoryName.super_IString.str._M_len;
  uStack_74 = memoryName.super_IString.str._M_len._4_4_;
  uStack_70 = memoryName.super_IString.str._M_str._0_4_;
  uStack_6c = memoryName.super_IString.str._M_str._4_4_;
  local_b0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)type.id;
  (*this->externalInterface->_vptr_ExternalInterface[0xb])
            (ptr.value.type.id,this->externalInterface,&local_b0,addr.addr,
             memoryName.super_IString.str._M_len,memoryName.super_IString.str._M_str);
  wasm::Literal::~Literal
            ((Literal *)
             &ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
  return (Literal *)TVar1.id;
}

Assistant:

Literal doAtomicLoad(
    Address addr, Index bytes, Type type, Name memoryName, Address memorySize) {
    checkAtomicAddress(addr, bytes, memorySize);
    Const ptr;
    ptr.value = Literal(int32_t(addr));
    ptr.type = Type::i32;
    Load load;
    load.bytes = bytes;
    // When an atomic loads a partial number of bytes for the type, it is
    // always an unsigned extension.
    load.signed_ = false;
    load.align = bytes;
    load.isAtomic = true; // understatement
    load.ptr = &ptr;
    load.type = type;
    load.memory = memoryName;
    return externalInterface->load(&load, addr, memoryName);
  }